

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O0

void __thiscall
mp::SPAdapter::GetRealizations(SPAdapter *this,int con_index,CallExpr random,int *arg_index)

{
  Expr e;
  Expr e_00;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  undefined8 uVar4;
  size_type sVar5;
  SafeBool SVar6;
  uint *in_RCX;
  int __c;
  int in_ESI;
  long in_RDI;
  int num_realizations;
  NumericConstant constant;
  int start_arg_index;
  int *core_var_index;
  int var_index;
  Reference var;
  value_type *rv;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  RandomVector *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  uint uVar7;
  undefined8 in_stack_ffffffffffffff08;
  int index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  Error *in_stack_ffffffffffffff48;
  CStringRef in_stack_ffffffffffffff50;
  ExprBase in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 uVar8;
  Error *in_stack_ffffffffffffff78;
  CStringRef in_stack_ffffffffffffff80;
  BasicCStringRef<char> local_58;
  reference local_50;
  RandomVarInfo local_48;
  int local_3c;
  ExprBase local_38;
  Reference local_30;
  reference local_28;
  uint *local_20;
  int local_14;
  
  local_20 = in_RCX;
  local_14 = in_ESI;
  local_28 = std::vector<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>
             ::operator[]((vector<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>
                           *)(in_RDI + 0xf0),(long)in_ESI);
  pcVar3 = (char *)(ulong)*local_20;
  local_38.impl_ =
       (Impl *)CallExpr::arg((CallExpr *)
                             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0);
  e.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffeec;
  e.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffee8;
  local_30 = Cast<mp::Reference>(e);
  pcVar3 = Reference::index(&local_30,pcVar3,__c);
  local_3c = (int)pcVar3;
  iVar1 = RandomVector::num_elements
                    ((RandomVector *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  RandomVarInfo::RandomVarInfo(&local_48,(int)pcVar3,local_14,iVar1);
  std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>::
  push_back((vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_> *)
            in_stack_fffffffffffffef0,
            (value_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  local_50 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x138),(long)local_3c);
  if (*local_50 != 0) {
    uVar8 = CONCAT13(1,(int3)in_stack_ffffffffffffff74);
    uVar4 = __cxa_allocate_exception(0x18);
    fmt::BasicCStringRef<char>::BasicCStringRef
              (&local_58,"{}: variable {} used in multiple random vectors");
    (anonymous_namespace)::lcon_name_abi_cxx11_((int)((ulong)uVar4 >> 0x20));
    Error::Error<std::__cxx11::string,int>
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(uVar8,in_stack_ffffffffffffff70),(int *)in_stack_ffffffffffffff68.impl_);
    __cxa_throw(uVar4,&Error::typeinfo,Error::~Error);
  }
  sVar5 = std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>::
          size((vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
                *)(in_RDI + 0x108));
  *local_50 = -(int)sVar5;
  uVar2 = *local_20 + 1;
  *local_20 = uVar2;
  while( true ) {
    uVar7 = *local_20;
    iVar1 = CallExpr::num_args((CallExpr *)0x1c6bc5);
    index = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    if (iVar1 <= (int)uVar7) break;
    CallExpr::arg((CallExpr *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0);
    e_00.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffeec;
    e_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffee8;
    Cast<mp::NumericConstant>(e_00);
    SVar6 = internal::ExprBase::operator_cast_to_function_pointer
                      ((ExprBase *)&stack0xffffffffffffff68);
    index = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    if (SVar6 == 0) break;
    NumericConstant::value((NumericConstant *)0x1c6c2e);
    RandomVector::Add(in_stack_fffffffffffffef0,
                      (double)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    *local_20 = *local_20 + 1;
  }
  uVar7 = *local_20;
  iVar1 = RandomVector::num_realizations((RandomVector *)0x1c6c6e);
  if (iVar1 == 0) {
    RandomVector::set_num_realizations(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  }
  else {
    iVar1 = RandomVector::num_realizations((RandomVector *)0x1c6c96);
    if (iVar1 != uVar7 - uVar2) {
      uVar4 = __cxa_allocate_exception(0x18);
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)&stack0xffffffffffffff50,
                 "{}: inconsistent number of realizations");
      (anonymous_namespace)::lcon_name_abi_cxx11_(index);
      Error::Error<std::__cxx11::string>
                (in_stack_ffffffffffffff48,in_stack_ffffffffffffff50,in_stack_ffffffffffffff40);
      __cxa_throw(uVar4,&Error::typeinfo,Error::~Error);
    }
  }
  return;
}

Assistant:

void SPAdapter::GetRealizations(int con_index, CallExpr random,
                                int &arg_index) {
  // Add a random variable.
  auto &rv = rvs_[con_index];
  auto var = Cast<Reference>(random.arg(arg_index));
  int var_index = var.index();
  random_vars_.push_back(RandomVarInfo(
                           var_index, con_index, rv.num_elements()));
  int &core_var_index = var_orig2core_[var_index];
  if (core_var_index != 0) {
    throw Error("{}: variable {} used in multiple random vectors",
                lcon_name(con_index), var_index);
  }
  // Mark variable as random.
  core_var_index = -static_cast<int>(random_vars_.size());

  // Get realizatons.
  int start_arg_index = ++arg_index;
  for (; ; ++arg_index) {
    if (arg_index >= random.num_args()) break;
    auto constant = Cast<NumericConstant>(random.arg(arg_index));
    if (!constant) break;
    rv.Add(constant.value());
  }
  int num_realizations = arg_index - start_arg_index;
  if (rv.num_realizations() == 0) {
    rv.set_num_realizations(num_realizations);
  } else if (rv.num_realizations() != num_realizations) {
    throw Error("{}: inconsistent number of realizations",
                lcon_name(con_index));
  }
}